

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall sf::String::String(String *this,char ansiChar,locale *locale)

{
  Uint32 __c;
  locale *locale_local;
  char ansiChar_local;
  String *this_local;
  
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  basic_string(&this->m_string);
  __c = Utf<32U>::decodeAnsi<char>(ansiChar,locale);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  operator+=(&this->m_string,__c);
  return;
}

Assistant:

String::String(char ansiChar, const std::locale& locale)
{
    m_string += Utf32::decodeAnsi(ansiChar, locale);
}